

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::DiscardOStream::DiscardOStream(DiscardOStream *this)

{
  std::ios::ios((ios *)&this->field_0x448);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x136770;
  *(undefined8 *)&this->field_0x448 = 0x136798;
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__001367b0);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)0x136770;
  *(undefined8 *)&this->field_0x448 = 0x136798;
  {unnamed_type#1}::DiscardOStream((_unnamed_type_1_ *)&(this->super_ostream).field_0x8);
  return;
}

Assistant:

DiscardOStream()
            : std::ostream(&discardBuf) {}